

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::
StandardWriterPageState<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::~StandardWriterPageState
          (StandardWriterPageState<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
           *this)

{
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var1;
  
  (this->super_ColumnWriterPageState)._vptr_ColumnWriterPageState =
       (_func_int **)&PTR__StandardWriterPageState_024cf438;
  AllocatedData::~AllocatedData(&(this->bss_encoder).buffer);
  _Var1._M_head_impl =
       (this->dlba_encoder).stream.
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (MemoryStream *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
  }
  (this->dlba_encoder).stream.
  super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = (MemoryStream *)0x0;
  AllocatedData::~AllocatedData(&(this->dlba_encoder).buffer);
  return;
}

Assistant:

explicit StandardWriterPageState(const idx_t total_value_count, const idx_t total_string_size,
	                                 duckdb_parquet::Encoding::type encoding_p,
	                                 const PrimitiveDictionary<SRC, TGT, OP> &dictionary_p)
	    : encoding(encoding_p), dbp_initialized(false), dbp_encoder(total_value_count), dlba_initialized(false),
	      dlba_encoder(total_value_count, total_string_size), bss_initialized(false),
	      bss_encoder(total_value_count, sizeof(TGT)), dictionary(dictionary_p), dict_written_value(false),
	      dict_bit_width(RleBpDecoder::ComputeBitWidth(dictionary.GetSize())), dict_encoder(dict_bit_width) {
	}